

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

int fct_filter_pass(char *prefix,char *test_str)

{
  char cVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  char cVar5;
  uint uVar6;
  char *pcVar7;
  char cVar8;
  bool bVar9;
  
  if (test_str == (char *)0x0) {
    __assert_fail("test_str != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x163
                  ,"int fct_filter_pass(const char *, const char *)");
  }
  uVar4 = 1;
  if ((prefix != (char *)0x0) && (*prefix != '\0')) {
    bVar9 = *prefix == '\0';
    if ((bVar9) || (*test_str == '\0')) {
      uVar6 = 0;
    }
    else {
      pcVar7 = prefix + 1;
      pcVar2 = test_str + 1;
      cVar3 = *test_str;
      cVar1 = *prefix;
      do {
        cVar5 = cVar1;
        cVar8 = cVar3;
        test_str = pcVar2;
        if (cVar5 != cVar8) {
          test_str = test_str + -1;
          break;
        }
        cVar1 = *pcVar7;
        bVar9 = cVar1 == '\0';
        if (bVar9) break;
        pcVar7 = pcVar7 + 1;
        pcVar2 = test_str + 1;
        cVar3 = *test_str;
      } while (*test_str != '\0');
      uVar6 = (uint)(cVar5 == cVar8);
    }
    uVar4 = 0;
    if (*test_str != '\0') {
      uVar4 = uVar6;
    }
    if (bVar9) {
      uVar4 = uVar6;
    }
  }
  return uVar4;
}

Assistant:

static nbool_t
fct_filter_pass(char const *prefix, char const *test_str)
{
    nbool_t is_match = FCT_FALSE;
    char const *prefix_p;
    char const *test_str_p;

    /* If you got nothing to test against, why test? */
    FCT_ASSERT( test_str != NULL );

    /* When the prefix is NULL or blank, we always return FCT_TRUE. */
    if ( prefix == NULL  || prefix[0] == '\0' )
    {
        return FCT_TRUE;
    }

    /* Iterate through both character arrays at the same time. We are
    going to play a game and see if we can beat the house. */
    for ( prefix_p = prefix, test_str_p = test_str;
            *prefix_p != '\0' && *test_str_p != '\0';
            ++prefix_p, ++test_str_p )
    {
        is_match = *prefix_p == *test_str_p;
        if ( !is_match )
        {
            break;   /* Quit the first time we don't match. */
        }
    }

    /* If the iterator for the test_str is pointing at the null char, and
    the iterator for the prefix string is not, then the prefix string is
    larger than the actual test string, and therefore we failed to pass the
    filter. */
    if ( *test_str_p == '\0' && *prefix_p != '\0' )
    {
        return FCT_FALSE;
    }

    /* is_match will be set to the either FCT_TRUE if we kicked of the loop
    early because our filter ran out of characters or FCT_FALSE if we
    encountered a mismatch before our filter ran out of characters. */
    return is_match;
}